

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O1

bool __thiscall crnlib::threaded_resampler::resample(threaded_resampler *this,params *p)

{
  vector<crnlib::vec<4U,_float>_> *this_00;
  params *ppVar1;
  bool bVar2;
  uint uVar3;
  Contrib_List *pCVar4;
  executable_task *peVar5;
  uint min_new_capacity;
  long lVar6;
  task_pool *ptVar7;
  
  free_contrib_lists(this);
  this->m_pParams = p;
  if ((ulong)p->m_fmt < 3) {
    this->m_bytes_per_pixel = *(uint *)(&DAT_001a8e4c + (ulong)p->m_fmt * 4);
    uVar3 = find_resample_filter(p->m_Pfilter_name);
    if (-1 < (int)uVar3) {
      lVar6 = (ulong)uVar3 * 0x30;
      ppVar1 = this->m_pParams;
      pCVar4 = Resampler::make_clist
                         (ppVar1->m_src_width,ppVar1->m_dst_width,ppVar1->m_boundary_op,
                          *(_func_Resample_Real_Resample_Real **)(&DAT_001ceac0 + lVar6),
                          *(Resample_Real *)(&DAT_001ceac8 + lVar6),p->m_filter_x_scale,0.0);
      this->m_pX_contribs = pCVar4;
      if (pCVar4 != (Contrib_List *)0x0) {
        ppVar1 = this->m_pParams;
        pCVar4 = Resampler::make_clist
                           (ppVar1->m_src_height,ppVar1->m_dst_height,ppVar1->m_boundary_op,
                            *(_func_Resample_Real_Resample_Real **)(&DAT_001ceac0 + lVar6),
                            *(Resample_Real *)(&DAT_001ceac8 + lVar6),p->m_filter_y_scale,0.0);
        this->m_pY_contribs = pCVar4;
        if (pCVar4 != (Contrib_List *)0x0) {
          this_00 = &this->m_tmp_img;
          min_new_capacity = this->m_pParams->m_src_height * this->m_pParams->m_dst_width;
          uVar3 = (this->m_tmp_img).m_size;
          if (uVar3 != min_new_capacity) {
            if (((uVar3 <= min_new_capacity) && ((this->m_tmp_img).m_capacity < min_new_capacity))
               && (bVar2 = elemental_vector::increase_capacity
                                     ((elemental_vector *)this_00,min_new_capacity,
                                      uVar3 + 1 == min_new_capacity,0x10,(object_mover)0x0,true),
                  !bVar2)) {
              return false;
            }
            (this->m_tmp_img).m_size = min_new_capacity;
          }
          ptVar7 = this->m_pTask_pool;
          uVar3 = 0;
          do {
            peVar5 = (executable_task *)crnlib_malloc(0x28);
            peVar5->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce628;
            peVar5[1]._vptr_executable_task = (_func_int **)this;
            peVar5[2]._vptr_executable_task = (_func_int **)resample_x_task;
            peVar5[3]._vptr_executable_task = (_func_int **)0x0;
            *(undefined4 *)&peVar5[4]._vptr_executable_task = 1;
            task_pool::queue_task(ptVar7,peVar5,(ulong)uVar3,(void *)0x0);
            uVar3 = uVar3 + 1;
            ptVar7 = this->m_pTask_pool;
          } while (uVar3 <= ptVar7->m_num_threads);
          task_pool::join(ptVar7);
          ptVar7 = this->m_pTask_pool;
          uVar3 = 0;
          do {
            peVar5 = (executable_task *)crnlib_malloc(0x28);
            peVar5->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce628;
            peVar5[1]._vptr_executable_task = (_func_int **)this;
            peVar5[2]._vptr_executable_task = (_func_int **)resample_y_task;
            peVar5[3]._vptr_executable_task = (_func_int **)0x0;
            *(undefined4 *)&peVar5[4]._vptr_executable_task = 1;
            task_pool::queue_task(ptVar7,peVar5,(ulong)uVar3,(void *)0x0);
            uVar3 = uVar3 + 1;
            ptVar7 = this->m_pTask_pool;
          } while (uVar3 <= ptVar7->m_num_threads);
          task_pool::join(ptVar7);
          if (this_00->m_p != (vec<4U,_float> *)0x0) {
            crnlib_free(this_00->m_p);
            this_00->m_p = (vec<4U,_float> *)0x0;
            (this->m_tmp_img).m_size = 0;
            (this->m_tmp_img).m_capacity = 0;
          }
          free_contrib_lists(this);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool threaded_resampler::resample(const params& p)
    {
        free_contrib_lists();

        m_pParams = &p;

        CRNLIB_ASSERT(m_pParams->m_src_width && m_pParams->m_src_height);
        CRNLIB_ASSERT(m_pParams->m_dst_width && m_pParams->m_dst_height);

        switch (p.m_fmt)
        {
        case cPF_Y_F32:
            m_bytes_per_pixel = 4;
            break;
        case cPF_RGBX_F32:
        case cPF_RGBA_F32:
            m_bytes_per_pixel = 16;
            break;
        default:
            CRNLIB_ASSERT(false);
            return false;
        }

        int filter_index = find_resample_filter(p.m_Pfilter_name);
        if (filter_index < 0)
        {
            return false;
        }

        const resample_filter& filter = g_resample_filters[filter_index];

        m_pX_contribs = Resampler::make_clist(m_pParams->m_src_width, m_pParams->m_dst_width, m_pParams->m_boundary_op,
            filter.func, filter.support, p.m_filter_x_scale, 0.0f);
        if (!m_pX_contribs)
        {
            return false;
        }

        m_pY_contribs = Resampler::make_clist(m_pParams->m_src_height, m_pParams->m_dst_height,
            m_pParams->m_boundary_op, filter.func, filter.support, p.m_filter_y_scale,
            0.0f);
        if (!m_pY_contribs)
        {
            return false;
        }

        if (!m_tmp_img.try_resize(m_pParams->m_dst_width * m_pParams->m_src_height))
        {
            return false;
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &threaded_resampler::resample_x_task, i, nullptr);
        }
        m_pTask_pool->join();

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &threaded_resampler::resample_y_task, i, nullptr);
        }
        m_pTask_pool->join();

        m_tmp_img.clear();
        free_contrib_lists();

        return true;
    }